

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

cmList * __thiscall cmList::sort(cmList *this,SortConfiguration *cfg)

{
  ComparisonFunction *pCVar1;
  CompareMethod CVar2;
  pointer pbVar3;
  pointer pbVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  long lVar5;
  bool bVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  _Any_data *p_Var13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_00;
  _Any_data *p_Var14;
  code **ppcVar15;
  bool bVar16;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  _Any_data *p_Var17;
  StringSorter sorter;
  _Val_comp_iter<(anonymous_namespace)::StringSorter> local_4b8;
  _Any_data local_450 [2];
  _Any_data local_430;
  undefined8 local_420 [2];
  _Any_data local_410;
  code *local_400;
  undefined1 local_3f0;
  long local_3e8;
  _Any_data local_3e0;
  long local_3d0 [2];
  _Any_data local_3c0;
  undefined8 local_3b0 [2];
  _Any_data local_3a0;
  _Manager_type local_390;
  _Invoker_type local_388;
  undefined1 local_380;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_378;
  _Any_data local_358;
  _Manager_type local_348;
  _Invoker_type p_Stack_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  undefined1 local_318;
  _Any_data local_308;
  long local_2f8 [2];
  _Any_data local_2e8;
  undefined8 local_2d8 [2];
  _Any_data local_2c8;
  _Manager_type local_2b8;
  _Invoker_type p_Stack_2b0;
  undefined1 local_2a8;
  _Any_data local_2a0;
  long local_290 [2];
  _Any_data local_280;
  undefined8 local_270 [2];
  _Any_data local_260;
  _Manager_type local_250;
  _Invoker_type p_Stack_248;
  undefined1 local_240;
  _Any_data local_238 [2];
  _Any_data local_218;
  undefined8 local_208 [2];
  _Any_data local_1f8;
  code *local_1e8;
  undefined1 local_1d8;
  _Any_data local_1d0 [2];
  _Any_data local_1b0;
  undefined8 local_1a0 [2];
  _Any_data local_190;
  code *local_180;
  undefined1 local_170;
  _Any_data local_168 [2];
  _Any_data local_148;
  undefined8 local_138 [2];
  _Any_data local_128;
  code *local_118;
  undefined1 local_108;
  _Any_data local_100 [2];
  _Any_data local_e0;
  undefined8 local_d0 [2];
  _Any_data local_c0;
  code *local_b0;
  undefined1 local_a0;
  _Any_data local_98 [2];
  _Any_data local_78;
  undefined8 local_68 [2];
  _Any_data local_58;
  code *local_48;
  undefined1 local_38;
  
  CVar2 = cfg->Compare;
  if (cfg->Order < DESCENDING && (cfg->Case < INSENSITIVE && CVar2 < FILE_BASENAME)) {
    pbVar3 = (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar4) {
      uVar11 = (long)pbVar4 - (long)pbVar3 >> 5;
      lVar12 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar3,pbVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar3,pbVar4);
    }
  }
  else {
    local_378.super__Function_base._M_manager = (_Manager_type)0x0;
    local_378._M_invoker = (_Invoker_type)0x0;
    local_378.super__Function_base._M_functor._M_unused._M_object = (code *)0x0;
    local_378.super__Function_base._M_functor._8_8_ = 0;
    if (CVar2 == FILE_BASENAME) {
      local_378.super__Function_base._M_functor._M_unused._M_object =
           cmsys::SystemTools::GetFilenameName;
      local_378._M_invoker =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_invoke;
      local_378.super__Function_base._M_manager =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_manager;
    }
    local_348 = (_Manager_type)0x0;
    p_Stack_340 = (_Invoker_type)0x0;
    local_358._M_unused._M_object = (code *)0x0;
    local_358._8_8_ = 0;
    if (cfg->Case == INSENSITIVE) {
      local_358._M_unused._M_object = cmsys::SystemTools::LowerCase;
      p_Stack_340 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    ::_M_invoke;
      local_348 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::_M_manager;
    }
    local_338._M_unused._M_object = (void *)0x0;
    local_338._8_8_ = 0;
    local_320 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:133:7)>
                ::_M_invoke;
    if (CVar2 == NATURAL) {
      local_320 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:128:9)>
                  ::_M_invoke;
    }
    local_328 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:133:7)>
                ::_M_manager;
    if (CVar2 == NATURAL) {
      local_328 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:128:9)>
                  ::_M_manager;
    }
    local_318 = cfg->Order == DESCENDING;
    __first._M_current =
         (this->Values).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->Values).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    bVar16 = false;
    __x = &local_378;
    p_Var14 = local_1d0;
    do {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)p_Var14,__x);
      bVar6 = !bVar16;
      bVar16 = true;
      __x = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_358;
      p_Var14 = &local_1b0;
    } while (bVar6);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_190,
               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_338);
    local_170 = local_318;
    bVar16 = false;
    p_Var14 = local_1d0;
    p_Var13 = &local_308;
    do {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)p_Var13,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)p_Var14);
      bVar6 = !bVar16;
      bVar16 = true;
      p_Var14 = &local_1b0;
      p_Var13 = &local_2e8;
    } while (bVar6);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_2c8,
               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_190);
    local_388 = p_Stack_2b0;
    local_2a8 = local_170;
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12)
           = 0;
      *(undefined8 *)
       ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 8) = 0;
      *(undefined8 *)((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_manager + lVar12)
           = 0;
      lVar5 = *(long *)((long)local_2f8 + lVar12);
      *(undefined8 *)((long)&local_4b8._M_comp.Filters[0]._M_invoker + lVar12) =
           *(undefined8 *)((long)local_2f8 + lVar12 + 8);
      if (lVar5 != 0) {
        uVar7 = *(undefined4 *)((long)&local_308 + lVar12 + 4);
        uVar8 = *(undefined4 *)((long)&local_308 + lVar12 + 8);
        uVar9 = *(undefined4 *)((long)&local_308 + lVar12 + 0xc);
        *(undefined4 *)
         ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12) =
             *(undefined4 *)((long)&local_308 + lVar12);
        *(undefined4 *)
         ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 4) = uVar7;
        *(undefined4 *)
         ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 8) = uVar8;
        *(undefined4 *)
         ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 0xc) =
             uVar9;
        *(long *)((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_manager + lVar12) =
             lVar5;
        *(undefined8 *)((long)local_2f8 + lVar12) = 0;
        *(undefined8 *)((long)local_2f8 + lVar12 + 8) = 0;
      }
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x40);
    pCVar1 = &local_4b8._M_comp.SortMethod;
    local_4b8._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_4b8._M_comp.SortMethod.super__Function_base._M_functor._8_8_ = 0;
    local_4b8._M_comp.SortMethod.super__Function_base._M_manager = (_Manager_type)0x0;
    local_4b8._M_comp.SortMethod._M_invoker = p_Stack_2b0;
    if (local_2b8 != (_Manager_type)0x0) {
      local_4b8._M_comp.SortMethod.super__Function_base._M_functor._4_4_ = local_2c8._4_4_;
      local_4b8._M_comp.SortMethod.super__Function_base._M_functor._0_4_ = local_2c8._0_4_;
      local_4b8._M_comp.SortMethod.super__Function_base._M_functor._12_4_ = local_2c8._12_4_;
      local_4b8._M_comp.SortMethod.super__Function_base._M_functor._8_4_ = local_2c8._8_4_;
      local_4b8._M_comp.SortMethod.super__Function_base._M_manager = local_2b8;
      local_2b8 = (_Manager_type)0x0;
      p_Stack_2b0 = (_Invoker_type)0x0;
    }
    local_4b8._M_comp.Descending = (bool)local_170;
    lVar12 = 0;
    do {
      *(undefined8 *)((long)&local_3e0 + lVar12) = 0;
      *(undefined8 *)((long)&local_3e0 + lVar12 + 8) = 0;
      *(undefined8 *)((long)local_3d0 + lVar12) = 0;
      lVar5 = *(long *)((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_manager + lVar12
                       );
      *(undefined8 *)((long)local_3d0 + lVar12 + 8) =
           *(undefined8 *)((long)&local_4b8._M_comp.Filters[0]._M_invoker + lVar12);
      if (lVar5 != 0) {
        uVar7 = *(undefined4 *)
                 ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 4);
        uVar8 = *(undefined4 *)
                 ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 8);
        uVar9 = *(undefined4 *)
                 ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 0xc
                 );
        *(undefined4 *)((long)&local_3e0 + lVar12) =
             *(undefined4 *)
              ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12);
        *(undefined4 *)((long)&local_3e0 + lVar12 + 4) = uVar7;
        *(undefined4 *)((long)&local_3e0 + lVar12 + 8) = uVar8;
        *(undefined4 *)((long)&local_3e0 + lVar12 + 0xc) = uVar9;
        *(long *)((long)local_3d0 + lVar12) = lVar5;
        *(undefined8 *)
         ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_manager + lVar12) = 0;
        *(undefined8 *)((long)&local_4b8._M_comp.Filters[0]._M_invoker + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x40);
    local_3a0._M_unused._M_object = (void *)0x0;
    local_3a0._8_8_ = 0;
    local_390 = (_Manager_type)0x0;
    if (local_4b8._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_3a0._M_unused._M_object =
           local_4b8._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object;
      local_3a0._8_8_ = local_4b8._M_comp.SortMethod.super__Function_base._M_functor._8_8_;
      local_390 = local_4b8._M_comp.SortMethod.super__Function_base._M_manager;
      local_4b8._M_comp.SortMethod.super__Function_base._M_manager = (_Manager_type)0x0;
      local_4b8._M_comp.SortMethod._M_invoker = (_Invoker_type)0x0;
    }
    local_380 = local_170;
    if (local_4b8._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_4b8._M_comp.SortMethod.super__Function_base._M_manager)
                ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
    }
    lVar12 = -0x40;
    p_Var14 = (_Any_data *)(local_4b8._M_comp.Filters + 1);
    do {
      if (*(code **)(p_Var14 + 1) != (code *)0x0) {
        (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
      }
      p_Var14 = p_Var14 + -2;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    if (__first._M_current != __last._M_current) {
      p_Var14 = local_168 + 2;
      local_3e8 = (long)__last._M_current - (long)__first._M_current;
      lVar12 = 0x3f;
      if (local_3e8 >> 5 != 0) {
        for (; (ulong)(local_3e8 >> 5) >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      bVar16 = false;
      p_Var13 = local_168;
      p_Var17 = &local_3e0;
      do {
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)p_Var13,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)p_Var17);
        bVar6 = !bVar16;
        bVar16 = true;
        p_Var13 = p_Var14;
        p_Var17 = &local_3c0;
      } while (bVar6);
      p_Var13 = local_168 + 4;
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)p_Var13,
                 (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_3a0);
      local_108 = local_380;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                (__first,__last,(ulong)(((uint)lVar12 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)local_168);
      if (local_118 != (code *)0x0) {
        (*local_118)(p_Var13,p_Var13,__destroy_functor);
      }
      lVar12 = -0x40;
      do {
        if (*(code **)(p_Var14 + 1) != (code *)0x0) {
          (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
        }
        p_Var14 = p_Var14 + -2;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
      bVar16 = false;
      p_Var14 = local_450;
      p_Var13 = &local_3e0;
      do {
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)p_Var14,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)p_Var13);
        bVar6 = !bVar16;
        bVar16 = true;
        p_Var14 = &local_430;
        p_Var13 = &local_3c0;
      } while (bVar6);
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_410,
                 (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_3a0);
      local_3f0 = local_380;
      if (local_3e8 < 0x201) {
        p_Var14 = local_100 + 2;
        p_Var13 = local_450;
        bVar16 = false;
        p_Var17 = local_100;
        do {
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)p_Var17,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)p_Var13);
          p_Var13 = &local_430;
          bVar6 = !bVar16;
          bVar16 = true;
          p_Var17 = p_Var14;
        } while (bVar6);
        p_Var13 = local_100 + 4;
        std::
        function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)p_Var13,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_410);
        local_a0 = local_3f0;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                  (__first,__last,(_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)local_100)
        ;
        if (local_b0 != (code *)0x0) {
          (*local_b0)(p_Var13,p_Var13,__destroy_functor);
        }
        lVar12 = -0x40;
        do {
          if (*(code **)(p_Var14 + 1) != (code *)0x0) {
            (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
          }
          p_Var14 = p_Var14 + -2;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0);
      }
      else {
        p_Var14 = local_98 + 2;
        __last_00._M_current = __first._M_current + 0x10;
        p_Var13 = local_450;
        bVar16 = false;
        p_Var17 = local_98;
        do {
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)p_Var17,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)p_Var13);
          p_Var13 = &local_430;
          bVar6 = !bVar16;
          bVar16 = true;
          p_Var17 = p_Var14;
        } while (bVar6);
        p_Var13 = local_98 + 4;
        std::
        function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)p_Var13,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_410);
        local_38 = local_3f0;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                  (__first,__last_00,
                   (_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)local_98);
        if (local_48 != (code *)0x0) {
          (*local_48)(p_Var13,p_Var13,__destroy_functor);
        }
        lVar12 = -0x40;
        do {
          if (*(code **)(p_Var14 + 1) != (code *)0x0) {
            (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
          }
          p_Var14 = p_Var14 + -2;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0);
        p_Var14 = local_450;
        bVar16 = false;
        p_Var13 = local_238;
        do {
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)p_Var13,
                     (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)p_Var14);
          p_Var14 = &local_430;
          bVar6 = !bVar16;
          bVar16 = true;
          p_Var13 = &local_218;
        } while (bVar6);
        std::
        function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_1f8,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_410);
        local_1d8 = local_3f0;
        if (__last_00._M_current != __last._M_current) {
          do {
            bVar16 = false;
            p_Var14 = local_238;
            p_Var13 = &local_2a0;
            do {
              std::
              function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)p_Var13,
                         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)p_Var14);
              bVar6 = !bVar16;
              bVar16 = true;
              p_Var14 = &local_218;
              p_Var13 = &local_280;
            } while (bVar6);
            std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_260,
                       (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_1f8);
            local_240 = local_1d8;
            lVar12 = 0;
            do {
              *(undefined8 *)
               ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12) = 0;
              *(undefined8 *)
               ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 8) =
                   0;
              *(undefined8 *)
               ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_manager + lVar12) = 0;
              lVar5 = *(long *)((long)local_290 + lVar12);
              *(undefined8 *)((long)&local_4b8._M_comp.Filters[0]._M_invoker + lVar12) =
                   *(undefined8 *)((long)local_290 + lVar12 + 8);
              if (lVar5 != 0) {
                uVar10 = *(undefined8 *)((long)&local_2a0 + lVar12 + 8);
                *(undefined8 *)
                 ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12) =
                     *(undefined8 *)((long)&local_2a0 + lVar12);
                *(undefined8 *)
                 ((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_functor + lVar12 + 8)
                     = uVar10;
                *(long *)((long)&local_4b8._M_comp.Filters[0].super__Function_base._M_manager +
                         lVar12) = lVar5;
                *(undefined8 *)((long)local_290 + lVar12) = 0;
                *(undefined8 *)((long)local_290 + lVar12 + 8) = 0;
              }
              lVar12 = lVar12 + 0x20;
            } while (lVar12 != 0x40);
            local_4b8._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object =
                 (void *)0x0;
            local_4b8._M_comp.SortMethod.super__Function_base._M_functor._8_8_ = 0;
            local_4b8._M_comp.SortMethod.super__Function_base._M_manager = (_Manager_type)0x0;
            local_4b8._M_comp.SortMethod._M_invoker = p_Stack_248;
            if (local_250 != (_Manager_type)0x0) {
              local_4b8._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object =
                   local_260._M_unused._M_object;
              local_4b8._M_comp.SortMethod.super__Function_base._M_functor._8_8_ = local_260._8_8_;
              local_4b8._M_comp.SortMethod.super__Function_base._M_manager = local_250;
              local_250 = (_Manager_type)0x0;
              p_Stack_248 = (_Invoker_type)0x0;
            }
            local_4b8._M_comp.Descending = (bool)local_1d8;
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::StringSorter>>
                      (__last_00,&local_4b8);
            if (local_4b8._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0)
            {
              pCVar1 = &local_4b8._M_comp.SortMethod;
              (*local_4b8._M_comp.SortMethod.super__Function_base._M_manager)
                        ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
            }
            lVar12 = -0x40;
            p_Var14 = (_Any_data *)(local_4b8._M_comp.Filters + 1);
            do {
              if (*(code **)(p_Var14 + 1) != (code *)0x0) {
                (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
              }
              p_Var14 = p_Var14 + -2;
              lVar12 = lVar12 + 0x20;
            } while (lVar12 != 0);
            if (local_250 != (_Manager_type)0x0) {
              (*local_250)(&local_260,&local_260,__destroy_functor);
            }
            lVar12 = -0x40;
            p_Var14 = &local_280;
            do {
              if (*(code **)(p_Var14 + 1) != (code *)0x0) {
                (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
              }
              p_Var14 = p_Var14 + -2;
              lVar12 = lVar12 + 0x20;
            } while (lVar12 != 0);
            __last_00._M_current = __last_00._M_current + 1;
          } while (__last_00._M_current != __last._M_current);
        }
        if (local_1e8 != (code *)0x0) {
          (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
        }
        lVar12 = -0x40;
        p_Var14 = &local_218;
        do {
          if (*(code **)(p_Var14 + 1) != (code *)0x0) {
            (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
          }
          p_Var14 = p_Var14 + -2;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0);
      }
      if (local_400 != (code *)0x0) {
        (*local_400)(&local_410,&local_410,__destroy_functor);
      }
      lVar12 = -0x40;
      p_Var14 = &local_430;
      do {
        if (*(code **)(p_Var14 + 1) != (code *)0x0) {
          (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
        }
        p_Var14 = p_Var14 + -2;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0);
    }
    if (local_390 != (_Manager_type)0x0) {
      (*local_390)(&local_3a0,&local_3a0,__destroy_functor);
    }
    lVar12 = -0x40;
    p_Var14 = &local_3c0;
    do {
      if (*(code **)(p_Var14 + 1) != (code *)0x0) {
        (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
      }
      p_Var14 = p_Var14 + -2;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    if (local_2b8 != (_Manager_type)0x0) {
      (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
    }
    lVar12 = -0x40;
    p_Var14 = &local_2e8;
    do {
      if (*(code **)(p_Var14 + 1) != (code *)0x0) {
        (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
      }
      p_Var14 = p_Var14 + -2;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    if (local_180 != (code *)0x0) {
      (*local_180)(&local_190,&local_190,__destroy_functor);
    }
    lVar12 = -0x40;
    p_Var14 = &local_1b0;
    do {
      if (*(code **)(p_Var14 + 1) != (code *)0x0) {
        (**(code **)(p_Var14 + 1))(p_Var14,p_Var14,__destroy_functor);
      }
      p_Var14 = p_Var14 + -2;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
    if (local_328 != (code *)0x0) {
      (*local_328)(&local_338,&local_338,__destroy_functor);
    }
    lVar12 = -0x40;
    ppcVar15 = (code **)&local_358;
    do {
      if (ppcVar15[2] != (code *)0x0) {
        (*ppcVar15[2])(ppcVar15,ppcVar15,3);
      }
      ppcVar15 = ppcVar15 + 0xfffffffffffffffc;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0);
  }
  return this;
}

Assistant:

cmList& cmList::sort(const SortConfiguration& cfg)
{
  SortConfiguration config{ cfg };

  if (config.Order == SortConfiguration::OrderMode::DEFAULT) {
    config.Order = SortConfiguration::OrderMode::ASCENDING;
  }
  if (config.Compare == SortConfiguration::CompareMethod::DEFAULT) {
    config.Compare = SortConfiguration::CompareMethod::STRING;
  }
  if (config.Case == SortConfiguration::CaseSensitivity::DEFAULT) {
    config.Case = SortConfiguration::CaseSensitivity::SENSITIVE;
  }

  if ((config.Compare == SortConfiguration::CompareMethod::STRING) &&
      (config.Case == SortConfiguration::CaseSensitivity::SENSITIVE) &&
      (config.Order == SortConfiguration::OrderMode::ASCENDING)) {
    std::sort(this->Values.begin(), this->Values.end());
  } else {
    StringSorter sorter(config);
    std::sort(this->Values.begin(), this->Values.end(), sorter);
  }

  return *this;
}